

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void variance16_kernel_sse2(uint8_t *src,uint8_t *ref,__m128i *sse,__m128i *sum)

{
  longlong in_RCX;
  longlong lVar1;
  longlong in_RDX;
  __m128i *in_R8;
  __m128i *in_R9;
  __m128i src_00;
  __m128i src_01;
  __m128i ref_00;
  __m128i ref_01;
  __m128i ref1;
  __m128i src1;
  __m128i ref0;
  __m128i src0;
  __m128i r;
  __m128i s;
  __m128i zero;
  longlong extraout_RDX;
  
  src_00[1] = in_RCX;
  src_00[0] = in_RDX;
  ref_00[1] = in_RCX;
  ref_00[0] = in_RDX;
  lVar1 = in_RCX;
  variance_kernel_sse2(src_00,ref_00,in_R8,in_R9);
  src_01[1] = in_RCX;
  src_01[0] = in_RDX;
  ref_01[1] = lVar1;
  ref_01[0] = extraout_RDX;
  variance_kernel_sse2(src_01,ref_01,in_R8,in_R9);
  return;
}

Assistant:

static inline void variance16_kernel_sse2(const uint8_t *const src,
                                          const uint8_t *const ref,
                                          __m128i *const sse,
                                          __m128i *const sum) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i s = _mm_loadu_si128((const __m128i *)src);
  const __m128i r = _mm_loadu_si128((const __m128i *)ref);
  const __m128i src0 = _mm_unpacklo_epi8(s, zero);
  const __m128i ref0 = _mm_unpacklo_epi8(r, zero);
  const __m128i src1 = _mm_unpackhi_epi8(s, zero);
  const __m128i ref1 = _mm_unpackhi_epi8(r, zero);

  variance_kernel_sse2(src0, ref0, sse, sum);
  variance_kernel_sse2(src1, ref1, sse, sum);
}